

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O2

int32_t ucptrie_internalU8PrevIndex_63(UCPTrie *trie,UChar32 c,uint8_t *start,uint8_t *src)

{
  long lVar1;
  uint c_00;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint8_t *s;
  int32_t i;
  
  lVar3 = (long)src - (long)start;
  lVar1 = 7;
  if (lVar3 < 8) {
    lVar1 = lVar3;
  }
  s = src + -7;
  if (lVar3 < 8) {
    s = start;
  }
  i = (int)lVar1;
  c_00 = utf8_prevCharSafeBody_63(s,0,&i,c,-1);
  uVar4 = (int)lVar1 - i;
  if (c_00 < 0x10000) {
    iVar2 = (c_00 & 0x3f) + (uint)trie->index[c_00 >> 6];
  }
  else if (c_00 < 0x110000) {
    if ((int)c_00 < trie->highStart) {
      i = uVar4;
      iVar2 = ucptrie_internalSmallIndex_63(trie,c_00);
    }
    else {
      iVar2 = trie->dataLength + -2;
    }
  }
  else {
    iVar2 = trie->dataLength + -1;
  }
  return iVar2 << 3 | uVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_internalU8PrevIndex(const UCPTrie *trie, UChar32 c,
                            const uint8_t *start, const uint8_t *src) {
    int32_t i, length;
    // Support 64-bit pointers by avoiding cast of arbitrary difference.
    if ((src - start) <= 7) {
        i = length = (int32_t)(src - start);
    } else {
        i = length = 7;
        start = src - 7;
    }
    c = utf8_prevCharSafeBody(start, 0, &i, c, -1);
    i = length - i;  // Number of bytes read backward from src.
    int32_t idx = _UCPTRIE_CP_INDEX(trie, 0xffff, c);
    return (idx << 3) | i;
}